

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall DecPOMDPDiscrete::CreateNewRewardModel(DecPOMDPDiscrete *this)

{
  DecPOMDPDiscrete *in_stack_00000110;
  
  CreateNewRewardModel(in_stack_00000110);
  return;
}

Assistant:

void DecPOMDPDiscrete::CreateNewRewardModel()
{
    if(_m_initialized)
    delete(_m_p_rModel);

    if(GetSparse())
        _m_p_rModel = new RewardModelMappingSparse( GetNrStates(), GetNrJointActions());
    else
        _m_p_rModel = new RewardModelMapping( GetNrStates(), GetNrJointActions());
}